

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hh
# Opt level: O3

void __thiscall JSON::JSON_number::~JSON_number(JSON_number *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_JSON_value)._vptr_JSON_value = (_func_int **)&PTR__JSON_number_002edf48;
  pcVar2 = (this->encoded)._M_dataplus._M_p;
  paVar1 = &(this->encoded).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

~JSON_number() override = default;